

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

_Bool upb_Arena_TryExtend(upb_Arena *a,void *ptr,size_t oldsize,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t extend;
  size_t size_local;
  size_t oldsize_local;
  void *ptr_local;
  upb_Arena *a_local;
  
  if (ptr == (void *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                  ,0x62,"_Bool upb_Arena_TryExtend(struct upb_Arena *, void *, size_t, size_t)");
  }
  if (oldsize < size) {
    uVar1 = size + 7 & 0xfffffffffffffff8;
    uVar2 = oldsize + 7 & 0xfffffffffffffff8;
    if (uVar1 == uVar2) {
      a_local._7_1_ = true;
    }
    else {
      uVar1 = uVar1 - uVar2;
      if (((char *)((long)ptr + uVar2) == a->ptr_dont_copy_me__upb_internal_use_only) &&
         (sVar3 = _upb_ArenaHas_dont_copy_me__upb_internal_use_only(a), uVar1 <= sVar3)) {
        a->ptr_dont_copy_me__upb_internal_use_only =
             a->ptr_dont_copy_me__upb_internal_use_only + uVar1;
        return true;
      }
      a_local._7_1_ = false;
    }
    return a_local._7_1_;
  }
  __assert_fail("size > oldsize",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                ,99,"_Bool upb_Arena_TryExtend(struct upb_Arena *, void *, size_t, size_t)");
}

Assistant:

UPB_API_INLINE bool upb_Arena_TryExtend(struct upb_Arena* a, void* ptr,
                                        size_t oldsize, size_t size) {
  UPB_TSAN_CHECK_WRITE(a->UPB_ONLYBITS(ptr));
  UPB_ASSERT(ptr);
  UPB_ASSERT(size > oldsize);
  size = UPB_ALIGN_MALLOC(size) + UPB_ASAN_GUARD_SIZE;
  oldsize = UPB_ALIGN_MALLOC(oldsize) + UPB_ASAN_GUARD_SIZE;
  if (size == oldsize) {
    return true;
  }
  size_t extend = size - oldsize;
  if ((char*)ptr + oldsize == a->UPB_ONLYBITS(ptr) &&
      UPB_PRIVATE(_upb_ArenaHas)(a) >= extend) {
    a->UPB_ONLYBITS(ptr) += extend;
    UPB_UNPOISON_MEMORY_REGION((char*)ptr + (oldsize - UPB_ASAN_GUARD_SIZE),
                               extend);
    return true;
  }
  return false;
}